

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfontstash.h
# Opt level: O2

int glfonsRasterize(FONScontext *ctx,fsuint textId,char *s,uint color)

{
  undefined8 uVar1;
  int iVar2;
  GLFONScontext *gl;
  pointer pfVar3;
  FONSshaping *pFVar4;
  mapped_type pGVar5;
  uint uVar6;
  GLFONSbuffer *pGVar7;
  size_t sVar8;
  mapped_type *ppGVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  size_t sVar13;
  long lVar14;
  short sVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  uint utf8state;
  fsuint textId_local;
  mapped_type local_60;
  char *local_58;
  long local_50;
  GLFONSbuffer *local_48;
  GLFONScontext *local_40;
  uint codepoint;
  
  gl = (GLFONScontext *)(ctx->params).userPtr;
  textId_local = textId;
  pGVar7 = glfons__bufferBound(gl);
  local_58 = s;
  fVar16 = fonsDrawText(ctx,0.0,0.0,s,(char *)0x0,'\0');
  if ((int)fVar16 == -1) {
    iVar12 = 1;
  }
  else {
    local_60 = (mapped_type)operator_new(0x20);
    uVar11 = (long)(pGVar7->interleavedArray).super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pGVar7->interleavedArray).super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    local_60->offset = (long)uVar11 >> 2;
    lVar14 = (long)(int)(uVar11 >> 2);
    utf8state = 0;
    std::vector<float,_std::allocator<float>_>::resize
              (&pGVar7->interleavedArray,(long)ctx->nverts * (gl->layout).nbComponents + lVar14,
               (value_type_conflict1 *)&utf8state);
    iVar12 = ctx->nverts;
    lVar14 = lVar14 + 3;
    fVar17 = INFINITY;
    fVar18 = INFINITY;
    fVar19 = -INFINITY;
    fVar20 = -INFINITY;
    for (lVar10 = 0; lVar10 < (long)iVar12 * 2; lVar10 = lVar10 + 2) {
      pfVar3 = (pGVar7->interleavedArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = *(undefined8 *)(ctx->verts + lVar10);
      fVar21 = (float)uVar1;
      fVar22 = (float)((ulong)uVar1 >> 0x20);
      *(undefined8 *)(pfVar3 + lVar14 + -3) = uVar1;
      fVar17 = (float)(~-(uint)(fVar21 < fVar17) & (uint)fVar17 |
                      (uint)fVar21 & -(uint)(fVar21 < fVar17));
      fVar18 = (float)(~-(uint)(fVar22 < fVar18) & (uint)fVar18 |
                      (uint)fVar22 & -(uint)(fVar22 < fVar18));
      fVar19 = (float)(~-(uint)(fVar19 < fVar21) & (uint)fVar19 |
                      (uint)fVar21 & -(uint)(fVar19 < fVar21));
      fVar20 = (float)(~-(uint)(fVar20 < fVar22) & (uint)fVar20 |
                      (uint)fVar22 & -(uint)(fVar20 < fVar22));
      pfVar3[lVar14 + -1] = ctx->tcoords[lVar10];
      pfVar3[lVar14] = ctx->tcoords[lVar10 + 1];
      lVar14 = lVar14 + 8;
    }
    local_60->bbox[0] = fVar17 + 3.0;
    local_60->bbox[1] = fVar18 + -3.0;
    local_60->bbox[2] = fVar19 + 3.0;
    local_60->bbox[3] = fVar20 + -3.0;
    local_60->length = (float)((int)fVar16 + -6);
    pFVar4 = ctx->shaping;
    local_40 = gl;
    if ((pFVar4 == (FONSshaping *)0x0) ||
       (iVar2 = ctx->nstates, ctx->states[(long)iVar2 + -1].useShaping == 0)) {
      local_50 = (long)iVar12;
      local_48 = pGVar7;
      sVar8 = strlen(local_58);
      utf8state = 0;
      codepoint = 0;
      sVar15 = 0;
      for (sVar13 = 0; sVar8 != sVar13; sVar13 = sVar13 + 1) {
        uVar6 = fons__decutf8(&utf8state,&codepoint,(uint)(byte)local_58[sVar13]);
        sVar15 = sVar15 + (ushort)(uVar6 == 0);
      }
      local_60->nbGlyph = sVar15;
      iVar12 = (int)local_50;
      pGVar7 = local_48;
    }
    else {
      sVar15 = (short)pFVar4->result->glyphCount;
      local_60->nbGlyph = sVar15;
      pFVar4->it = -1;
      ctx->states[(long)iVar2 + -1].useShaping = 0;
    }
    pGVar5 = local_60;
    local_60->padding = sVar15 * (short)(int)(local_40->layout).nbComponents * 6;
    pGVar7->nVerts = pGVar7->nVerts + iVar12;
    ctx->nverts = 0;
    ppGVar9 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_GLFONSstash_*>,_std::allocator<std::pair<const_unsigned_int,_GLFONSstash_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_GLFONSstash_*>,_std::allocator<std::pair<const_unsigned_int,_GLFONSstash_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&pGVar7->stashes,&textId_local);
    *ppGVar9 = pGVar5;
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

int glfonsRasterize(FONScontext* ctx, fsuint textId, const char* s, unsigned int color) {
    (void) color;
    GLFONScontext* gl = (GLFONScontext*) ctx->params.userPtr;
    GLFONSbuffer* buffer = glfons__bufferBound(gl);

    int length = fonsDrawText(ctx, 0, 0, s, NULL, 0);

    if (length == -1.f) {
        return GLFONS_INVALID;
    }

    GLFONSstash* stash = new GLFONSstash;

    stash->offset = buffer->interleavedArray.size();

    // pre-allocate data for this text id
    int oldSize = buffer->interleavedArray.size();
    buffer->interleavedArray.resize(oldSize + gl->layout.nbComponents * ctx->nverts, 0);

    float inf = std::numeric_limits<float>::infinity();
    float x0 = inf, x1 = -inf, y0 = inf, y1 = -inf;

    for(int i = 0, index = oldSize; i < ctx->nverts * 2; i += 2) {
        float x, y;

        x = ctx->verts[i];
        y = ctx->verts[i + 1];

        x0 = x < x0 ? x : x0;
        x1 = x > x1 ? x : x1;
        y0 = y < y0 ? y : y0;
        y1 = y > y1 ? y : y1;

        buffer->interleavedArray[index++] = x;
        buffer->interleavedArray[index++] = y;
        buffer->interleavedArray[index++] = ctx->tcoords[i];
        buffer->interleavedArray[index++] = ctx->tcoords[i + 1];
        index += 4; // skip screenPos / alpha / rotation
    }

    // remove extra-offset used for interpolation in fontstash
    stash->bbox[0] = x0 + 3;
    stash->bbox[1] = y0 - 3;
    stash->bbox[2] = x1 + 3;
    stash->bbox[3] = y1 - 3;

    stash->length = length - 6;

    if(ctx->shaping != NULL && fons__getState(ctx)->useShaping) {
        FONSshapingRes* res = ctx->shaping->result;
        stash->nbGlyph = res->glyphCount;
        fons__clearShaping(ctx);
    } else {
        const char* str = s;
        const char* end = s + strlen(s);
        int i = 0;
        unsigned int utf8state = 0;
        unsigned int codepoint = 0;

        // count glyphs
        for (; str != end; ++str) {
            if (fons__decutf8(&utf8state, &codepoint, *(const unsigned char*)str))
                continue;
            i++;
        }
        stash->nbGlyph = i;
    }

    stash->padding = stash->nbGlyph * GLYPH_VERTS * gl->layout.nbComponents;

    // hack : reset fontstash state
    buffer->nVerts += ctx->nverts;
    ctx->nverts = 0;

    buffer->stashes[textId] = stash;

    return GLFONS_VALID;
}